

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = add(3,2);
  iVar2 = mul(3,2);
  iVar3 = sub(3,2);
  iVar4 = 1;
  if (((iVar1 == 5) && (iVar2 == 6)) && (iVar3 == 1)) {
    std::operator<<((ostream *)&std::cout,"Everything seems to be working.\n");
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int main()
{
    int a = add(3, 2);
    int m = mul(3, 2);
    int s = sub(3, 2);

    if (a != 5)
        return 1;

    if (m != 6)
        return 1;

    if (s != 1)
        return 1;

    std::cout << "Everything seems to be working.\n";
}